

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

int greatest_do_assert_equal_t(void *expd,void *got,greatest_type_info *type_info,void *udata)

{
  int eq;
  void *udata_local;
  greatest_type_info *type_info_local;
  void *got_local;
  void *expd_local;
  
  if ((type_info == (greatest_type_info *)0x0) || (type_info->equal == (greatest_equal_cb *)0x0)) {
    expd_local._4_4_ = 0;
  }
  else {
    expd_local._4_4_ = (*type_info->equal)(expd,got,udata);
    if ((expd_local._4_4_ == 0) && (type_info->print != (greatest_printf_cb *)0x0)) {
      fprintf(_stdout,"\nExpected: ");
      (*type_info->print)(expd,udata);
      fprintf(_stdout,"\n     Got: ");
      (*type_info->print)(got,udata);
      fprintf(_stdout,"\n");
    }
  }
  return expd_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}